

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  undefined8 *puVar5;
  char *pcVar6;
  FILE *__stream;
  size_t sVar7;
  size_t sVar8;
  byte bVar9;
  char *pcVar10;
  char *pcVar11;
  addrinfo *ai;
  addrinfo hints;
  FILE *local_8b0;
  char *local_8a8;
  addrinfo *local_8a0;
  addrinfo local_898;
  int local_868 [526];
  
  fileName = *argv;
  local_8b0 = _stdout;
  local_8a8 = (char *)malloc(0x400);
  pcVar10 = "80";
  bVar9 = 0;
  bVar1 = false;
  do {
LAB_00101814:
    iVar3 = __posix_getopt(argc,argv,"p:o:d:");
    if (iVar3 == 0x70) {
      if (!bVar1) break;
      main_cold_3();
      goto LAB_00101b66;
    }
    if (iVar3 == -1) {
      pcVar11 = argv[_optind];
      if (pcVar11 == (char *)0x0) {
LAB_00101b70:
        main_cold_15();
LAB_00101b75:
        main_cold_5();
LAB_00101b7a:
        main_cold_6();
LAB_00101b7f:
        main_cold_14();
LAB_00101b84:
        main_cold_13();
LAB_00101b89:
        main_cold_12();
LAB_00101b8e:
        main_cold_11();
LAB_00101b93:
        main_cold_10();
LAB_00101b98:
        main_cold_7();
      }
      else {
        puVar5 = (undefined8 *)malloc(0x10);
        iVar3 = strncmp(pcVar11,"http://",7);
        if (iVar3 != 0) goto LAB_00101b75;
        pcVar11 = pcVar11 + 7;
        pcVar6 = strpbrk(pcVar11,";/?:@=&");
        if (pcVar6 == (char *)0x0) {
          pcVar11 = strdup(pcVar11);
          *puVar5 = pcVar11;
LAB_0010191f:
          pcVar6 = "index.html";
        }
        else {
          pcVar11 = strndup(pcVar11,(long)pcVar6 - (long)pcVar11);
          *puVar5 = pcVar11;
          if (pcVar6[1] == '\0') goto LAB_0010191f;
          pcVar6 = pcVar6 + 1;
        }
        pcVar11 = strdup(pcVar6);
        puVar5[1] = pcVar11;
        local_898.ai_flags = 0;
        local_898.ai_protocol = 0;
        local_898.ai_addrlen = 0;
        local_898._20_4_ = 0;
        local_898.ai_addr = (sockaddr *)0x0;
        local_898.ai_canonname = (char *)0x0;
        local_898.ai_next = (addrinfo *)0x0;
        local_898.ai_family = 2;
        local_898.ai_socktype = 1;
        iVar3 = getaddrinfo((char *)*puVar5,pcVar10,&local_898,&local_8a0);
        if (iVar3 != 0) goto LAB_00101b7a;
        iVar3 = socket(local_8a0->ai_family,local_8a0->ai_socktype,local_8a0->ai_protocol);
        if (iVar3 < 0) goto LAB_00101b7f;
        iVar4 = connect(iVar3,local_8a0->ai_addr,local_8a0->ai_addrlen);
        if (iVar4 < 0) goto LAB_00101b84;
        __stream = fdopen(iVar3,"r+");
        if (__stream == (FILE *)0x0) goto LAB_00101b89;
        memset(local_868,0,0x82c);
        pcVar10 = (char *)puVar5[1];
        sprintf((char *)local_868,"GET /%s HTTP/1.1\r\nHost: %s\r\nConnection: close\r\n\r\n",
                pcVar10,*puVar5);
        iVar3 = fputs((char *)local_868,__stream);
        if (iVar3 == -1) goto LAB_00101b8e;
        iVar3 = fflush(__stream);
        if (iVar3 == -1) goto LAB_00101b93;
        pcVar11 = (char *)malloc(0x400);
        fgets(pcVar11,0x400,__stream);
        iVar3 = __isoc99_sscanf(pcVar11,"HTTP/1.1 %d",local_868);
        if (iVar3 != 1) goto LAB_00101b98;
        if (local_868[0] == 200) {
          free(pcVar11);
          if (bVar9 != 0) {
            sVar7 = strlen(local_8a8);
            if ((bVar9 & 4) == 0) {
              pcVar11 = (char *)malloc(sVar7 + 1);
              strcpy(pcVar11,local_8a8);
            }
            else {
              sVar8 = strlen(pcVar10);
              pcVar11 = (char *)malloc(sVar7 + sVar8 + 2);
              strcpy(pcVar11,local_8a8);
              sVar7 = strlen(pcVar11);
              (pcVar11 + sVar7)[0] = '/';
              (pcVar11 + sVar7)[1] = '\0';
              strcat(pcVar11,pcVar10);
            }
            local_8b0 = fopen(pcVar11,"w");
            free(pcVar11);
            free(local_8a8);
            if (local_8b0 == (FILE *)0x0) goto LAB_00101bb2;
          }
          goToEndOfHeader((FILE *)__stream);
          writeFileToFile((FILE *)__stream,(FILE *)local_8b0);
          fflush(local_8b0);
          fclose(local_8b0);
          free((void *)*puVar5);
          free((void *)puVar5[1]);
          fclose(__stream);
          return 0;
        }
      }
      main_cold_8();
LAB_00101ba8:
      main_cold_2();
LAB_00101bad:
      main_cold_1();
LAB_00101bb2:
      main_cold_9();
      halt_baddata();
    }
    if (iVar3 == 100) {
      bVar2 = 4;
      if (bVar9 != 0) goto LAB_00101bad;
    }
    else {
      if (iVar3 != 0x6f) {
LAB_00101b6b:
        main_cold_16();
        goto LAB_00101b70;
      }
      bVar2 = 2;
      if (bVar9 != 0) goto LAB_00101ba8;
    }
    bVar9 = bVar9 | bVar2;
    local_8a8 = strdup(_optarg);
  } while( true );
  pcVar10 = strdup(_optarg);
  iVar3 = isValidPort(pcVar10);
  bVar1 = true;
  if (iVar3 == 0) {
LAB_00101b66:
    main_cold_4();
    goto LAB_00101b6b;
  }
  goto LAB_00101814;
}

Assistant:

int main(int argc, char *argv[]) {
	fileName = argv[0];
	FLAG_S flags = {0,0,0};
	FILE * out = stdout;
	char* p_port = "80";
	char *d_dir= malloc(sizeof(char)*CHARLENGTH);

	int c;
	while ((c= getopt(argc, argv, "p:o:d:")) != -1) {
		switch (c) {
		case 'p':
			if (flags.p_flag) { USAGE(); }
				 flags.p_flag++; 
				 p_port = strdup(optarg);
				 if (isValidPort(p_port) == 0) {
					 ERROR_EXIT("INVALID PORT");
				 }
				 break;
		case 'o':
			if (flags.o_flag || flags.d_flag) { USAGE(); }
				flags.o_flag++; 
				d_dir = strdup(optarg);
				break;
		case 'd':
			if(flags.o_flag || flags.d_flag) { USAGE(); }
				flags.d_flag++; 
				d_dir = strdup(optarg);
				break;
		default:
			USAGE();
		}
	}
	
	
	char * fullUrl;
	if ((fullUrl=argv[optind]) == NULL) {
		USAGE();
	}
	URL_S *url = URL(fullUrl);


	struct addrinfo hints, *ai;
	memset(&hints, 0, sizeof(hints));
	hints.ai_family = AF_INET; // create Internet Protocol (IP) socket
	hints.ai_socktype = SOCK_STREAM; // use TCP as transport protocol

	if (getaddrinfo(url->url, p_port, &hints, &ai) != 0) {ERROR_EXIT("getaddrinfo");}

	int sockfd;
	if ((sockfd = socket(ai->ai_family, ai->ai_socktype, ai->ai_protocol)) < 0) { ERROR_EXIT("socket"); }

	if ((connect(sockfd, ai->ai_addr, ai->ai_addrlen)) < 0)
		ERROR_EXIT("connection");

	FILE *sockfile = fdopen(sockfd, "r+");
	if (sockfile == NULL)
		ERROR_EXIT("fdopen");


	printHeader(sockfile,url);
	checkResponseHeader(sockfile);


	
	if (flags.o_flag || flags.d_flag) {
		char * pathOutFile;
		if (flags.d_flag) {
			pathOutFile = malloc((strlen(d_dir) + 2 + strlen(url->file)) * sizeof(char));
			strcpy(pathOutFile,d_dir);
			strcat(pathOutFile, "/");
			strcat(pathOutFile, url->file);
		} else{
			pathOutFile = malloc((strlen(d_dir) + 1) * sizeof(char));
			strcpy(pathOutFile,d_dir);
		}
		out = fopen(pathOutFile, "w");
		free(pathOutFile);
		free(d_dir);
		if (out == NULL) {ERROR_EXIT("Could not open File"); }
	}
	
	
	goToEndOfHeader(sockfile);
	writeFileToFile(sockfile,out);
	fflush(out);
	fclose(out);
	free_URL(url);
	fclose(sockfile);
	return 0;
}